

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ostream *poVar8;
  cmake *gname;
  pointer pcVar9;
  char *pcVar10;
  string *psVar11;
  cmCTestConfigureHandler *handler;
  string local_548;
  cmValue local_528;
  cmValue labelsForSubprojects;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  string *local_4b0;
  allocator<char> local_4a1;
  string local_4a0;
  cmValue local_480;
  cmValue cmakeGeneratorToolset;
  allocator<char> local_469;
  string local_468;
  cmValue local_448;
  cmValue cmakeGeneratorPlatform;
  string local_438;
  reference local_418;
  string *option;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  cmAlphaNum local_3f0;
  cmAlphaNum local_3c0;
  undefined1 local_390 [8];
  string cmakeConfigureCommand;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gg;
  undefined1 local_360 [6];
  bool cmakeBuildTypeInOptions;
  bool multiConfig;
  undefined1 local_340 [8];
  ostringstream e;
  undefined1 local_1c8 [8];
  string cmakelists_file;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  string *source_dir;
  allocator<char> local_121;
  string local_120;
  cmValue local_100;
  cmValue cmakeGeneratorName;
  allocator<char> local_e9;
  string local_e8;
  cmValue local_c8;
  cmValue ctestConfigureCommand;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string_view local_40;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  cmCTestConfigureCommand *this_local;
  
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Options);
    cmExpandList(local_40,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_30,false);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"BuildDirectory",&local_91)
  ;
  cmCTest::GetCTestConfiguration(&local_70,pcVar1,&local_90);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator<char> *)((long)&ctestConfigureCommand.Value + 7));
    cmCommand::SetError((cmCommand *)this,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ctestConfigureCommand.Value + 7));
    this_local = (cmCTestConfigureCommand *)0x0;
    ctestConfigureCommand.Value._0_4_ = 1;
    goto LAB_002cd4ff;
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CTEST_CONFIGURE_COMMAND",&local_e9);
  local_c8 = cmMakefile::GetDefinition(pcVar2,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  cmakeGeneratorName.Value = local_c8.Value;
  bVar4 = cmNonempty(local_c8);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar11 = cmValue::operator*[abi_cxx11_(&local_c8);
    cmCTest::SetCTestConfiguration
              (pcVar1,"ConfigureCommand",psVar11,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  else {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"CTEST_CMAKE_GENERATOR",&local_121);
    local_100 = cmMakefile::GetDefinition(pcVar2,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    source_dir = local_100.Value;
    bVar4 = cmNonempty(local_100);
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator<char> *)((long)&labelsForSubprojects.Value + 7));
      cmCommand::SetError((cmCommand *)this,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator((allocator<char> *)((long)&labelsForSubprojects.Value + 7));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand.Value._0_4_ = 1;
      goto LAB_002cd4ff;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"SourceDirectory",&local_179);
    cmCTest::GetCTestConfiguration(&local_158,pcVar1,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    local_138 = &local_158;
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     local_138,"/CMakeLists.txt");
      bVar4 = cmsys::SystemTools::FileExists((string *)local_1c8);
      if (bVar4) {
        gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
        _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._7_1_ = 0;
        bVar4 = false;
        gname = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
        psVar11 = cmValue::operator*[abi_cxx11_(&local_100);
        cmake::CreateGlobalGenerator
                  ((cmake *)((long)&cmakeConfigureCommand.field_2 + 8),(string *)gname,
                   SUB81(psVar11,0));
        bVar5 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr *)(cmakeConfigureCommand.field_2._M_local_buf + 8));
        if (bVar5) {
          pcVar9 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                   operator->((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                               *)((long)&cmakeConfigureCommand.field_2 + 8));
          iVar6 = (*pcVar9->_vptr_cmGlobalGenerator[0x26])();
          gg._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
          _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
          super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._7_1_ = (byte)iVar6 & 1;
          std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::reset
                    ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                     ((long)&cmakeConfigureCommand.field_2 + 8),(pointer)0x0);
        }
        cmAlphaNum::cmAlphaNum(&local_3c0,'\"');
        psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        cmAlphaNum::cmAlphaNum(&local_3f0,psVar11);
        __range3._7_1_ = 0x22;
        cmStrCat<char>((string *)local_390,&local_3c0,&local_3f0,(char *)((long)&__range3 + 7));
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_30);
        option = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_30);
        while( true ) {
          bVar5 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&option);
          if (!bVar5) break;
          local_418 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          std::__cxx11::string::operator+=((string *)local_390," \"");
          std::__cxx11::string::operator+=((string *)local_390,(string *)local_418);
          std::__cxx11::string::operator+=((string *)local_390,"\"");
          pcVar10 = (char *)std::__cxx11::string::c_str();
          pcVar10 = strstr(pcVar10,"CMAKE_BUILD_TYPE=");
          if (pcVar10 == (char *)0x0) {
            pcVar10 = (char *)std::__cxx11::string::c_str();
            pcVar10 = strstr(pcVar10,"CMAKE_BUILD_TYPE:STRING=");
            if (pcVar10 != (char *)0x0) goto LAB_002ccc8e;
          }
          else {
LAB_002ccc8e:
            bVar4 = true;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        if ((gg._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl._7_1_ == 0) && (!bVar4))
        {
          cmCTest::GetConfigType_abi_cxx11_
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)local_390," \"-DCMAKE_BUILD_TYPE:STRING=");
            psVar11 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
            std::__cxx11::string::operator+=((string *)local_390,(string *)psVar11);
            std::__cxx11::string::operator+=((string *)local_390,"\"");
          }
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"CTEST_USE_LAUNCHERS",
                   (allocator<char> *)((long)&cmakeGeneratorPlatform.Value + 7));
        bVar4 = cmMakefile::IsOn(pcVar2,&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&cmakeGeneratorPlatform.Value + 7));
        if (bVar4) {
          std::__cxx11::string::operator+=
                    ((string *)local_390," \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"");
        }
        std::__cxx11::string::operator+=((string *)local_390," \"-G");
        psVar11 = cmValue::operator*[abi_cxx11_(&local_100);
        std::__cxx11::string::operator+=((string *)local_390,(string *)psVar11);
        std::__cxx11::string::operator+=((string *)local_390,"\"");
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"CTEST_CMAKE_GENERATOR_PLATFORM",&local_469);
        local_448 = cmMakefile::GetDefinition(pcVar2,&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator(&local_469);
        cmakeGeneratorToolset.Value = local_448.Value;
        bVar4 = cmNonempty(local_448);
        if (bVar4) {
          std::__cxx11::string::operator+=((string *)local_390," \"-A");
          psVar11 = cmValue::operator*[abi_cxx11_(&local_448);
          std::__cxx11::string::operator+=((string *)local_390,(string *)psVar11);
          std::__cxx11::string::operator+=((string *)local_390,"\"");
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a0,"CTEST_CMAKE_GENERATOR_TOOLSET",&local_4a1);
        local_480 = cmMakefile::GetDefinition(pcVar2,&local_4a0);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::allocator<char>::~allocator(&local_4a1);
        local_4b0 = local_480.Value;
        bVar4 = cmNonempty(local_480);
        if (bVar4) {
          std::__cxx11::string::operator+=((string *)local_390," \"-T");
          psVar11 = cmValue::operator*[abi_cxx11_(&local_480);
          std::__cxx11::string::operator+=((string *)local_390,(string *)psVar11);
          std::__cxx11::string::operator+=((string *)local_390,"\"");
        }
        std::__cxx11::string::operator+=((string *)local_390," \"-S");
        std::__cxx11::string::operator+=((string *)local_390,(string *)local_138);
        std::__cxx11::string::operator+=((string *)local_390,"\"");
        std::__cxx11::string::operator+=((string *)local_390," \"-B");
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,"BuildDirectory",&local_4f1);
        cmCTest::GetCTestConfiguration(&local_4d0,pcVar1,&local_4f0);
        std::__cxx11::string::operator+=((string *)local_390,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
        std::__cxx11::string::operator+=((string *)local_390,"\"");
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand"
                   ,(string *)local_390,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
        std::__cxx11::string::~string((string *)local_390);
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                  ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   ((long)&cmakeConfigureCommand.field_2 + 8));
        ctestConfigureCommand.Value._0_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
        poVar8 = std::operator<<((ostream *)local_340,"CMakeLists.txt file does not exist [");
        poVar8 = std::operator<<(poVar8,(string *)local_1c8);
        std::operator<<(poVar8,"]");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,(string *)local_360);
        std::__cxx11::string::~string((string *)local_360);
        this_local = (cmCTestConfigureCommand *)0x0;
        ctestConfigureCommand.Value._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
      }
      std::__cxx11::string::~string((string *)local_1c8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator<char> *)(cmakelists_file.field_2._M_local_buf + 0xf));
      cmCommand::SetError((cmCommand *)this,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(cmakelists_file.field_2._M_local_buf + 0xf));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand.Value._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&local_158);
    if ((int)ctestConfigureCommand.Value != 0) goto LAB_002cd4ff;
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"CTEST_LABELS_FOR_SUBPROJECTS",
             (allocator<char> *)((long)&handler + 7));
  local_528 = cmMakefile::GetDefinition(pcVar2,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_528);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar11 = cmValue::operator*[abi_cxx11_(&local_528);
    cmCTest::SetCTestConfiguration
              (pcVar1,"LabelsForSubprojects",psVar11,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  this_local = (cmCTestConfigureCommand *)
               cmCTest::GetConfigureHandler
                         ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_local->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand
    [3])();
  cmCTestGenericHandler::SetQuiet
            ((cmCTestGenericHandler *)this_local,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  ctestConfigureCommand.Value._0_4_ = 1;
LAB_002cd4ff:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (!this->Options.empty()) {
    cmExpandList(this->Options, options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  cmValue ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (cmNonempty(ctestConfigureCommand)) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       *ctestConfigureCommand, this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmNonempty(cmakeGeneratorName)) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      auto gg = this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
        *cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        gg.reset();
      }

      std::string cmakeConfigureCommand =
        cmStrCat('"', cmSystemTools::GetCMakeCommand(), '"');

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += *cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      cmValue cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmNonempty(cmakeGeneratorPlatform)) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += *cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      cmValue cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmNonempty(cmakeGeneratorToolset)) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += *cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"-S";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      cmakeConfigureCommand += " \"-B";
      cmakeConfigureCommand +=
        this->CTest->GetCTestConfiguration("BuildDirectory");
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
                                         cmakeConfigureCommand, this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}